

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
mxx::impl::
sample_arbit_decomp<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,impl *this,long begin,
          int param_4,comm *param_5,undefined8 param_6)

{
  impl *piVar1;
  int iVar2;
  _func_int **pp_Var3;
  ulong uVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  pointer piVar8;
  pointer piVar9;
  long lVar10;
  pointer piVar11;
  size_type __new_size;
  long lVar12;
  size_t local_size;
  vector<int,_std::allocator<int>_> all_samples;
  ulong local_88;
  undefined8 local_80;
  ulong local_78;
  custom_op<unsigned_long,_true> local_70;
  
  local_88 = begin - (long)this >> 2;
  local_80 = param_6;
  custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
            ((custom_op<unsigned_long,true> *)&local_70);
  MPI_Allreduce(&local_88,&local_78,1,local_70.m_type_copy,local_70.m_op,param_5->mpi_comm);
  custom_op<unsigned_long,_true>::~custom_op(&local_70);
  iVar2 = param_5->m_size;
  lVar12 = (long)iVar2;
  lVar7 = (long)param_4;
  uVar4 = (local_88 * lVar7 * lVar12 + local_78) - 1;
  __new_size = 1;
  if (local_78 <= uVar4) {
    __new_size = uVar4 / local_78;
  }
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,__new_size);
  piVar5 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar11 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  lVar10 = (long)piVar11 - (long)piVar5;
  if (lVar10 != 0) {
    lVar10 = lVar10 >> 2;
    uVar4 = 0;
    do {
      piVar1 = this + ((local_88 / (__new_size + 1) - 1) +
                      (ulong)(uVar4 < local_88 % (__new_size + 1))) * 4;
      this = piVar1 + 4;
      piVar5[uVar4] = *(int *)piVar1;
      uVar4 = uVar4 + 1;
    } while (lVar10 + (ulong)(lVar10 == 0) != uVar4);
    piVar5 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  gatherv<int>((vector<int,_std::allocator<int>_> *)&local_70,piVar5,
               (long)piVar11 - (long)piVar5 >> 2,0,param_5);
  pp_Var3 = local_70._vptr_custom_op;
  if (param_5->m_rank == 0) {
    if (local_70._vptr_custom_op !=
        (_func_int **)local_70.m_user_func.super__Function_base._M_functor._M_unused._0_8_) {
      uVar4 = (long)local_70.m_user_func.super__Function_base._M_functor._M_unused._0_8_ -
              (long)local_70._vptr_custom_op >> 2;
      lVar10 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                (local_70._vptr_custom_op,
                 local_70.m_user_func.super__Function_base._M_functor._M_unused._M_object,
                 ((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                (pp_Var3,local_70.m_user_func.super__Function_base._M_functor._M_unused._M_object);
    }
    piVar11 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    piVar8 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    lVar10 = (long)piVar8 - (long)piVar11 >> 2;
    if (lVar10 != lVar12 + -1) {
      std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,lVar12 - 1);
      piVar11 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      piVar8 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      lVar10 = (long)piVar8 - (long)piVar11 >> 2;
    }
    piVar9 = piVar11;
    if (piVar8 != piVar11) {
      piVar5 = (int *)((long)local_70._vptr_custom_op + lVar7 * 4 + -4);
      lVar6 = 0;
      do {
        piVar11[lVar6] = *piVar5;
        lVar6 = lVar6 + 1;
        piVar5 = piVar5 + lVar7;
        piVar9 = piVar8;
      } while (lVar10 + (ulong)(lVar10 == 0) != lVar6);
    }
  }
  else {
    piVar11 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    piVar9 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  uVar4 = (long)piVar9 - (long)piVar11;
  if ((long)uVar4 >> 2 != lVar12 + -1) {
    std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,(long)(iVar2 + -1));
    piVar11 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar4 = (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar11;
  }
  MPI_Bcast(piVar11,uVar4 >> 2,local_80,0,param_5->mpi_comm);
  if (local_70._vptr_custom_op != (_func_int **)0x0) {
    operator_delete(local_70._vptr_custom_op);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_arbit_decomp(_Iterator begin, _Iterator end, _Compare comp, int s, const mxx::comm& comm, MPI_Datatype mpi_dt) {
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    std::size_t local_size = std::distance(begin, end);

    // get total size n
    std::size_t total_size = mxx::allreduce(local_size, comm);

    // p = number of processes
    int p = comm.size();

    //  pick a total of s*p samples, thus locally pick ceil((local_size/n)*s*p)
    //  and at least one samples from each processor.
    //  this will result in at least s*p samples.
    std::size_t local_s;
    if (local_size == 0)
        local_s = 0;
    else
        local_s = std::max<std::size_t>(((local_size*s*p)+total_size-1)/total_size, 1);

    //. init samples
    std::vector<value_type> local_splitters;

    // pick local samples
    if (local_s > 0) {
        local_splitters.resize(local_s);
        _Iterator pos = begin;
        for (std::size_t i = 0; i < local_splitters.size(); ++i)
        {
            std::size_t bucket_size = local_size / (local_s+1) + (i < (local_size % (local_s+1)) ? 1 : 0);
            // pick last element of each bucket
            pos += (bucket_size-1);
            local_splitters[i] = *pos;
            ++pos;
        }
    }

    // 2. gather samples to `rank = 0`
    // - TODO: rather call sample sort
    //         recursively and implement a base case for samplesort which does
    //         gather to rank=0, local sort and redistribute
    std::vector<value_type> all_samples = mxx::gatherv(local_splitters, 0, comm);

    // sort and pick p-1 samples on master
    if (comm.rank() == 0) {
        // 3. local sort on master
        std::sort(all_samples.begin(), all_samples.end(), comp);

        // 4. pick p-1 splitters and broadcast them
        if (local_splitters.size() != (size_t) p-1)
        {
            local_splitters.resize(p-1);
        }
        // split into `p` pieces and choose the `p-1` splitting elements
        _Iterator pos = all_samples.begin();
        for (std::size_t i = 0; i < local_splitters.size(); ++i)
        {
            std::size_t bucket_size = (p*s) / p + (i < static_cast<std::size_t>((p*s) % p) ? 1 : 0);
            // pick last element of each bucket
            local_splitters[i] = *(pos + (bucket_size-1));
            pos += bucket_size;
        }
    }

    // size splitters for receiving
    if (local_splitters.size() != (size_t)p-1) {
        local_splitters.resize(p-1);
    }

    // 4. broadcast and receive final splitters
    MPI_Bcast(&local_splitters[0], local_splitters.size(), mpi_dt, 0, comm);

    return local_splitters;
}